

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatchTest.h
# Opt level: O3

void __thiscall
oout::MatchTest::MatchTest<oout::ContainMatch>
          (MatchTest *this,shared_ptr<const_oout::Text> *text,shared_ptr<const_oout::Match> *match1,
          shared_ptr<const_oout::Match> *match2,shared_ptr<oout::ContainMatch> *matchn)

{
  undefined1 local_39;
  AllMatch *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<const_oout::Match> local_28;
  
  local_38 = (AllMatch *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::AllMatch,std::allocator<oout::AllMatch>,std::shared_ptr<oout::Match_const>const&,std::shared_ptr<oout::Match_const>const&,std::shared_ptr<oout::ContainMatch>const&>
            (&_Stack_30,&local_38,(allocator<oout::AllMatch> *)&local_39,match1,match2,matchn);
  local_28.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_38->super_Match;
  local_28.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_30._M_pi;
  local_38 = (AllMatch *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  MatchTest(this,text,&local_28);
  if (local_28.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  return;
}

Assistant:

MatchTest(
		const std::shared_ptr<const Text> &text,
		const std::shared_ptr<const Match> &match1,
		const std::shared_ptr<const Match> &match2,
		const std::shared_ptr<T> & ... matchn
	) : MatchTest(text, std::make_shared<AllMatch>(match1, match2, matchn...))
	{
	}